

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O2

void __thiscall
wabt::OptionParser::HandleArgument(OptionParser *this,size_t *arg_index,char *arg_value)

{
  ulong uVar1;
  pointer pAVar2;
  
  uVar1 = *arg_index;
  pAVar2 = (this->arguments_).
           super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar1 < (ulong)(((long)(this->arguments_).
                             super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2) / 0x50)) {
    std::function<void_(const_char_*)>::operator()(&pAVar2[uVar1].callback,arg_value);
    pAVar2[uVar1].handled_count = pAVar2[uVar1].handled_count + 1;
    if (pAVar2[uVar1].count == One) {
      *arg_index = *arg_index + 1;
    }
    return;
  }
  Errorf(this,"unexpected argument \'%s\'",arg_value);
  return;
}

Assistant:

void OptionParser::HandleArgument(size_t* arg_index, const char* arg_value) {
  if (*arg_index >= arguments_.size()) {
    Errorf("unexpected argument '%s'", arg_value);
    return;
  }
  Argument& argument = arguments_[*arg_index];
  argument.callback(arg_value);
  argument.handled_count++;

  if (argument.count == ArgumentCount::One) {
    (*arg_index)++;
  }
}